

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  ushort *puVar1;
  int iVar2;
  stbi__context *psVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  stbi_uc *psVar14;
  long lVar16;
  byte *pbVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  byte bVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  stbi_uc *psVar29;
  byte *pbVar30;
  ulong uVar31;
  bool bVar32;
  stbi_uc *local_e8;
  stbi_uc *local_e0;
  byte *local_c8;
  ulong local_78;
  ulong uVar15;
  
  uVar5 = (ulong)x;
  bVar32 = depth == 0x10;
  uVar8 = x * out_n;
  uVar9 = uVar8 << bVar32;
  psVar3 = a->s;
  iVar2 = psVar3->img_n;
  uVar10 = iVar2 << bVar32;
  if (iVar2 + 1 != out_n && iVar2 != out_n) {
    __assert_fail("out_n == s->img_n || out_n == s->img_n+1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb_image.h"
                  ,0x10c6,
                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                 );
  }
  psVar14 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar32,0);
  a->out = psVar14;
  if (psVar14 == (stbi_uc *)0x0) {
    stbi__g_failure_reason = "outofmem";
    return 0;
  }
  uVar11 = iVar2 * x;
  uVar12 = uVar11 * depth + 7 >> 3;
  uVar15 = (ulong)uVar12;
  uVar13 = (uVar12 + 1) * y;
  if ((psVar3->img_x == x) && (psVar3->img_y == y)) {
    if (uVar13 == raw_len) {
LAB_001624bd:
      lVar16 = (long)iVar2;
      lVar25 = (long)(out_n << bVar32);
      lVar26 = -lVar25;
      lVar28 = -(ulong)uVar9;
      uVar13 = 0;
      uVar27 = 0;
      local_78 = uVar5;
      do {
        if (uVar27 == y) {
          if (7 < depth) {
            if (depth == 0x10) {
              psVar14 = a->out;
              for (lVar16 = 0; uVar8 * y != (int)lVar16; lVar16 = lVar16 + 1) {
                puVar1 = (ushort *)(psVar14 + lVar16 * 2);
                *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
              }
              return 1;
            }
            return 1;
          }
          uVar10 = 0;
          uVar27 = 0;
          do {
            if (uVar27 == y) {
              return 1;
            }
            bVar7 = 1;
            if (color == 0) {
              bVar7 = ""[depth];
            }
            uVar22 = (ulong)uVar10;
            psVar14 = a->out;
            uVar20 = (ulong)(uVar9 * (int)uVar27);
            if (depth == 4) {
              lVar16 = (uVar8 - uVar15) + uVar22;
              lVar25 = 0;
              for (uVar12 = uVar11; 1 < (int)uVar12; uVar12 = uVar12 - 2) {
                psVar14[lVar25 * 2 + uVar22] = (psVar14[lVar25 + lVar16] >> 4) * bVar7;
                psVar14[lVar25 * 2 + uVar22 + 1] = (psVar14[lVar25 + lVar16] & 0xf) * bVar7;
                lVar25 = lVar25 + 1;
              }
              if (uVar12 == 1) {
                psVar14[lVar25 * 2 + uVar22] = (psVar14[lVar25 + lVar16] >> 4) * bVar7;
              }
            }
            else {
              pbVar30 = psVar14 + ((uVar8 + uVar20) - uVar15);
              if (depth == 2) {
                psVar14 = psVar14 + uVar22 + 3;
                for (uVar12 = uVar11; 3 < (int)uVar12; uVar12 = uVar12 - 4) {
                  psVar14[-3] = (*pbVar30 >> 6) * bVar7;
                  psVar14[-2] = (*pbVar30 >> 4 & 3) * bVar7;
                  psVar14[-1] = (*pbVar30 >> 2 & 3) * bVar7;
                  *psVar14 = (*pbVar30 & 3) * bVar7;
                  pbVar30 = pbVar30 + 1;
                  psVar14 = psVar14 + 4;
                }
                if (((0 < (int)uVar12) && (psVar14[-3] = (*pbVar30 >> 6) * bVar7, uVar12 != 1)) &&
                   (psVar14[-2] = (*pbVar30 >> 4 & 3) * bVar7, uVar12 == 3)) {
                  psVar14[-1] = (*pbVar30 >> 2 & 3) * bVar7;
                }
              }
              else if (depth == 1) {
                pbVar17 = psVar14 + uVar22 + 7;
                for (uVar12 = uVar11; 7 < (int)uVar12; uVar12 = uVar12 - 8) {
                  pbVar17[-7] = (char)*pbVar30 >> 7 & bVar7;
                  pbVar17[-6] = (char)(*pbVar30 * '\x02') >> 7 & bVar7;
                  pbVar17[-5] = (char)(*pbVar30 << 2) >> 7 & bVar7;
                  pbVar17[-4] = (char)(*pbVar30 << 3) >> 7 & bVar7;
                  pbVar17[-3] = (char)(*pbVar30 << 4) >> 7 & bVar7;
                  pbVar17[-2] = (char)(*pbVar30 << 5) >> 7 & bVar7;
                  pbVar17[-1] = (char)(*pbVar30 << 6) >> 7 & bVar7;
                  bVar23 = bVar7;
                  if ((*pbVar30 & 1) == 0) {
                    bVar23 = 0;
                  }
                  *pbVar17 = bVar23;
                  pbVar30 = pbVar30 + 1;
                  pbVar17 = pbVar17 + 8;
                }
                if (((((0 < (int)uVar12) && (pbVar17[-7] = (char)*pbVar30 >> 7 & bVar7, uVar12 != 1)
                      ) && ((pbVar17[-6] = (char)(*pbVar30 * '\x02') >> 7 & bVar7, 2 < uVar12 &&
                            ((pbVar17[-5] = (char)(*pbVar30 << 2) >> 7 & bVar7, uVar12 != 3 &&
                             (pbVar17[-4] = (char)(*pbVar30 << 3) >> 7 & bVar7, 4 < uVar12)))))) &&
                    (pbVar17[-3] = (char)(*pbVar30 << 4) >> 7 & bVar7, uVar12 != 5)) &&
                   (pbVar17[-2] = (char)(*pbVar30 << 5) >> 7 & bVar7, uVar12 == 7)) {
                  pbVar17[-1] = (char)(*pbVar30 << 6) >> 7 & bVar7;
                }
              }
            }
            if (iVar2 != out_n) {
              psVar14 = a->out;
              if (iVar2 == 1) {
                uVar12 = x * 2 - 1;
                for (iVar24 = 0; -1 < (int)((x - 1) + iVar24); iVar24 = iVar24 + -1) {
                  psVar14[uVar12 + uVar20] = 0xff;
                  psVar14[(uVar12 - 1) + uVar20] = psVar14[((x - 1) + iVar24 & 0x7fffffff) + uVar20]
                  ;
                  uVar12 = uVar12 - 2;
                }
              }
              else {
                iVar24 = x - 1;
                uVar22 = uVar5 * 3;
                uVar12 = x * 4;
                if (iVar2 != 3) {
                  __assert_fail("img_n == 3",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb_image.h"
                                ,0x1172,
                                "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                               );
                }
                while( true ) {
                  uVar22 = uVar22 - 3;
                  if (iVar24 < 0) break;
                  psVar14[(uVar12 - 1) + uVar20] = 0xff;
                  uVar31 = uVar22 & 0xffffffff;
                  psVar14[(uVar12 - 2) + uVar20] = psVar14[uVar31 + uVar20 + 2];
                  psVar14[(uVar12 - 3) + uVar20] = psVar14[uVar31 + uVar20 + 1];
                  psVar14[(uVar12 - 4) + uVar20] = psVar14[uVar31 + uVar20];
                  iVar24 = iVar24 + -1;
                  uVar12 = uVar12 - 4;
                }
              }
            }
            uVar27 = uVar27 + 1;
            uVar10 = uVar10 + uVar9;
          } while( true );
        }
        uVar20 = (ulong)*raw;
        if (4 < uVar20) {
          stbi__g_failure_reason = "invalid filter";
          return 0;
        }
        local_e8 = a->out + uVar9 * (int)uVar27;
        if (depth < 8) {
          if (x < uVar12) {
            __assert_fail("img_width_bytes <= x",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb_image.h"
                          ,0x10db,
                          "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                         );
          }
          local_e8 = local_e8 + (uVar8 - uVar12);
          uVar10 = 1;
          local_78 = uVar15;
        }
        if (uVar27 == 0) {
          uVar20 = (ulong)""[uVar20];
        }
        uVar22 = 0;
        if (0 < (int)uVar10) {
          uVar22 = (ulong)uVar10;
        }
        for (uVar31 = 0; uVar22 != uVar31; uVar31 = uVar31 + 1) {
          switch(uVar20) {
          case 0:
          case 1:
          case 5:
          case 6:
            bVar7 = raw[uVar31 + 1];
            break;
          case 2:
            bVar7 = local_e8[uVar31 + lVar28];
            goto LAB_00162671;
          case 3:
            bVar7 = local_e8[uVar31 + lVar28] >> 1;
LAB_00162671:
            bVar7 = bVar7 + raw[uVar31 + 1];
            break;
          case 4:
            bVar7 = raw[uVar31 + 1];
            iVar24 = stbi__paeth(0,(uint)local_e8[uVar31 + lVar28],0);
            bVar7 = (char)iVar24 + bVar7;
            break;
          default:
            goto switchD_00162628_default;
          }
          local_e8[uVar31] = bVar7;
switchD_00162628_default:
        }
        lVar18 = (long)(int)uVar10;
        if (depth == 8) {
          lVar19 = (long)out_n;
          lVar4 = lVar16;
          if (iVar2 != out_n) {
            local_e8[lVar16] = 0xff;
          }
LAB_001626eb:
          local_c8 = raw + lVar4 + 1;
        }
        else {
          if (depth == 0x10) {
            lVar19 = lVar25;
            lVar4 = lVar18;
            if (iVar2 != out_n) {
              local_e8[lVar18] = 0xff;
              local_e8[lVar18 + 1] = 0xff;
            }
            goto LAB_001626eb;
          }
          local_c8 = raw + 2;
          lVar19 = 1;
        }
        psVar14 = local_e8 + lVar19;
        local_e0 = local_e8 + lVar19 + lVar28;
        if (depth < 8 || iVar2 == out_n) {
          uVar21 = ((int)local_78 + -1) * uVar10;
          switch(uVar20) {
          case 0:
            memcpy(psVar14,local_c8,(long)(int)uVar21);
            break;
          case 1:
            uVar6 = uVar21;
            if ((int)uVar21 < 1) {
              uVar6 = 0;
            }
            for (uVar20 = 0; uVar6 != uVar20; uVar20 = uVar20 + 1) {
              psVar14[uVar20] = psVar14[uVar20 - lVar18] + local_c8[uVar20];
            }
            break;
          case 2:
            uVar6 = uVar21;
            if ((int)uVar21 < 1) {
              uVar6 = 0;
            }
            for (uVar20 = 0; uVar6 != uVar20; uVar20 = uVar20 + 1) {
              psVar14[uVar20] = psVar14[uVar20 + lVar28] + local_c8[uVar20];
            }
            break;
          case 3:
            uVar6 = uVar21;
            if ((int)uVar21 < 1) {
              uVar6 = 0;
            }
            uVar20 = (ulong)uVar6;
            pbVar30 = local_c8;
            while (bVar32 = uVar20 != 0, uVar20 = uVar20 - 1, bVar32) {
              *psVar14 = (char)((uint)psVar14[-lVar18] + (uint)psVar14[lVar28] >> 1) + *pbVar30;
              psVar14 = psVar14 + 1;
              pbVar30 = pbVar30 + 1;
            }
            break;
          case 4:
            uVar6 = uVar21;
            if ((int)uVar21 < 1) {
              uVar6 = 0;
            }
            for (uVar20 = 0; uVar20 != uVar6; uVar20 = uVar20 + 1) {
              bVar7 = local_c8[uVar20];
              iVar24 = stbi__paeth((uint)psVar14[uVar20 - lVar18],(uint)local_e0[uVar20],
                                   (uint)local_e0[uVar20 - lVar18]);
              psVar14[uVar20] = (char)iVar24 + bVar7;
            }
            break;
          case 5:
            uVar6 = uVar21;
            if ((int)uVar21 < 1) {
              uVar6 = 0;
            }
            for (uVar20 = 0; uVar6 != uVar20; uVar20 = uVar20 + 1) {
              psVar14[uVar20] = (psVar14[uVar20 - lVar18] >> 1) + local_c8[uVar20];
            }
            break;
          case 6:
            uVar6 = uVar21;
            if ((int)uVar21 < 1) {
              uVar6 = 0;
            }
            for (uVar20 = 0; uVar6 != uVar20; uVar20 = uVar20 + 1) {
              psVar14[uVar20] = psVar14[uVar20 - lVar18] + local_c8[uVar20];
            }
          }
          local_c8 = local_c8 + (int)uVar21;
        }
        else {
          if (iVar2 + 1 != out_n) {
            __assert_fail("img_n+1 == out_n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb_image.h"
                          ,0x1119,
                          "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                         );
          }
          switch(uVar20) {
          case 0:
            uVar20 = uVar5;
            while (uVar21 = (int)uVar20 - 1, uVar20 = (ulong)uVar21, uVar21 != 0) {
              for (uVar31 = 0; uVar22 != uVar31; uVar31 = uVar31 + 1) {
                psVar14[uVar31] = local_c8[uVar31];
              }
              psVar14[lVar18] = 0xff;
              local_c8 = local_c8 + lVar18;
              psVar14 = psVar14 + lVar25;
            }
            break;
          case 1:
            uVar20 = uVar5;
            while (uVar21 = (int)uVar20 - 1, uVar20 = (ulong)uVar21, uVar21 != 0) {
              for (uVar31 = 0; uVar22 != uVar31; uVar31 = uVar31 + 1) {
                psVar14[uVar31] = psVar14[uVar31 + lVar26] + local_c8[uVar31];
              }
              psVar14[lVar18] = 0xff;
              local_c8 = local_c8 + lVar18;
              psVar14 = psVar14 + lVar25;
            }
            break;
          case 2:
            uVar20 = uVar5;
            while (uVar21 = (int)uVar20 - 1, uVar20 = (ulong)uVar21, uVar21 != 0) {
              for (uVar31 = 0; uVar22 != uVar31; uVar31 = uVar31 + 1) {
                psVar14[uVar31] = psVar14[uVar31 + lVar28] + local_c8[uVar31];
              }
              psVar14[lVar18] = 0xff;
              local_c8 = local_c8 + lVar18;
              psVar14 = psVar14 + lVar25;
            }
            break;
          case 3:
            uVar20 = uVar5;
            while (uVar21 = (int)uVar20 - 1, uVar20 = (ulong)uVar21, pbVar30 = local_c8,
                  psVar29 = psVar14, uVar31 = uVar22, uVar21 != 0) {
              while (uVar31 != 0) {
                *psVar29 = (char)((uint)psVar29[lVar26] + (uint)psVar29[lVar28] >> 1) + *pbVar30;
                pbVar30 = pbVar30 + 1;
                psVar29 = psVar29 + 1;
                uVar31 = uVar31 - 1;
              }
              psVar14[lVar18] = 0xff;
              local_c8 = local_c8 + lVar18;
              psVar14 = psVar14 + lVar25;
            }
            break;
          case 4:
            psVar29 = local_e8 + lVar19 + lVar26;
            local_e8 = local_e8 + lVar19 + (lVar26 - (ulong)uVar9);
            uVar20 = uVar5;
            while (uVar21 = (int)uVar20 - 1, uVar21 != 0) {
              for (uVar20 = 0; uVar22 != uVar20; uVar20 = uVar20 + 1) {
                bVar7 = local_c8[uVar20];
                iVar24 = stbi__paeth((uint)psVar29[uVar20],(uint)local_e0[uVar20],
                                     (uint)local_e8[uVar20]);
                psVar14[uVar20] = (char)iVar24 + bVar7;
              }
              psVar14[lVar18] = 0xff;
              local_c8 = local_c8 + lVar18;
              psVar14 = psVar14 + lVar25;
              local_e0 = local_e0 + lVar25;
              psVar29 = psVar29 + lVar25;
              local_e8 = local_e8 + lVar25;
              uVar20 = (ulong)uVar21;
            }
            break;
          case 5:
            uVar20 = uVar5;
            while (uVar21 = (int)uVar20 - 1, uVar20 = (ulong)uVar21, uVar21 != 0) {
              for (uVar31 = 0; uVar22 != uVar31; uVar31 = uVar31 + 1) {
                psVar14[uVar31] = (psVar14[uVar31 + lVar26] >> 1) + local_c8[uVar31];
              }
              psVar14[lVar18] = 0xff;
              local_c8 = local_c8 + lVar18;
              psVar14 = psVar14 + lVar25;
            }
            break;
          case 6:
            uVar20 = uVar5;
            while (uVar21 = (int)uVar20 - 1, uVar20 = (ulong)uVar21, uVar21 != 0) {
              for (uVar31 = 0; uVar22 != uVar31; uVar31 = uVar31 + 1) {
                psVar14[uVar31] = psVar14[uVar31 + lVar26] + local_c8[uVar31];
              }
              psVar14[lVar18] = 0xff;
              local_c8 = local_c8 + lVar18;
              psVar14 = psVar14 + lVar25;
            }
          }
          if (depth == 0x10) {
            psVar14 = a->out + (long)(int)(uVar10 + 1) + (ulong)uVar13;
            uVar20 = uVar5;
            while (iVar24 = (int)uVar20, uVar20 = (ulong)(iVar24 - 1), iVar24 != 0) {
              *psVar14 = 0xff;
              psVar14 = psVar14 + lVar25;
            }
          }
        }
        uVar27 = uVar27 + 1;
        uVar13 = uVar13 + uVar9;
        raw = local_c8;
      } while( true );
    }
  }
  else if (uVar13 <= raw_len) goto LAB_001624bd;
  stbi__g_failure_reason = "not enough pixels";
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;
   if (s->img_x == x && s->img_y == y) {
      if (raw_len != img_len) return stbi__err("not enough pixels","Corrupt PNG");
   } else { // interlaced:
      if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");
   }

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }